

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelper.cpp
# Opt level: O2

string * __thiscall
phpconvert::StringHelper::join
          (string *__return_storage_ptr__,StringHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in,string *delim)

{
  boost::algorithm::
  join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
            (__return_storage_ptr__,(algorithm *)in,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)delim,delim);
  return __return_storage_ptr__;
}

Assistant:

string StringHelper::join(vector<string>& in, string& delim) {
	return boost::algorithm::join(in, delim);
}